

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O2

HelicsInput helicsFederateGetInput(HelicsFederate fed,char *key,HelicsError *err)

{
  size_t sVar1;
  Input *input;
  char *pcVar2;
  HelicsInput pvVar3;
  string_view name;
  shared_ptr<helics::ValueFederate> fedObj;
  ValueFederate *local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  getValueFedSharedPtr(&local_30,(HelicsError *)fed);
  if (local_30 != (ValueFederate *)0x0) {
    if (key == (char *)0x0) {
      if (err != (HelicsError *)0x0) {
        pcVar2 = "The supplied string argument is null and therefore invalid";
LAB_001830c2:
        err->error_code = -4;
        err->message = pcVar2;
      }
    }
    else {
      sVar1 = strlen(key);
      name._M_str = key;
      name._M_len = sVar1;
      input = helics::ValueFederate::getInput(local_30,name);
      if ((input->super_Interface).handle.hid != -1700000000) {
        pvVar3 = anon_unknown.dwarf_694c0::findOrCreateInput(fed,input);
        goto LAB_001830cf;
      }
      if (err != (HelicsError *)0x0) {
        pcVar2 = "the specified input name is a not a recognized input";
        goto LAB_001830c2;
      }
    }
  }
  pvVar3 = (HelicsInput)0x0;
LAB_001830cf:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  return pvVar3;
}

Assistant:

HelicsInput helicsFederateGetInput(HelicsFederate fed, const char* key, HelicsError* err)
{
    auto fedObj = getValueFedSharedPtr(fed, err);
    if (!fedObj) {
        return nullptr;
    }
    CHECK_NULL_STRING(key, nullptr);
    try {
        auto& input = fedObj->getInput(key);
        if (!input.isValid()) {
            assignError(err, HELICS_ERROR_INVALID_ARGUMENT, invalidInputName);
            return nullptr;
        }
        return findOrCreateInput(fed, input);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
        return nullptr;
    }
    // LCOV_EXCL_STOP
}